

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double english_word_length_mean(void)

{
  int iVar1;
  long lVar2;
  double dVar3;
  
  dVar3 = 0.0;
  iVar1 = 1;
  lVar2 = 0;
  do {
    dVar3 = dVar3 + (double)iVar1 * *(double *)((long)&DAT_0021ced0 + lVar2);
    iVar1 = iVar1 + 1;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0xd8);
  return dVar3 / 0.99997;
}

Assistant:

double english_word_length_mean ( )

//****************************************************************************80
//
//  Purpose:
//
//    ENGLISH_WORD_LENGTH_MEAN evaluates the mean of the English Word Length PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    31 July 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Henry Kucera, Winthrop Francis,
//    Computational Analysis of Present-Day American English,
//    Brown University Press, 1967.
//
//  Parameters:
//
//    Output, double ENGLISH_WORD_LENGTH_MEAN, the mean of the PDF.
//
{
# define WORD_LENGTH_MAX 27

  int j;
  double mean;
  double pdf_vec[WORD_LENGTH_MAX] = {
    0.03160,
    0.16975,
    0.21192,
    0.15678,
    0.10852,
    0.08524,
    0.07724,
    0.05623,
    0.04032,
    0.02766,
    0.01582,
    0.00917,
    0.00483,
    0.00262,
    0.00099,
    0.00050,
    0.00027,
    0.00022,
    0.00011,
    0.00006,
    0.00005,
    0.00002,
    0.00001,
    0.00001,
    0.00001,
    0.00001,
    0.00001 };
  double pdf_sum = 0.99997;

  mean = 0.0;
  for ( j = 1; j <= WORD_LENGTH_MAX; j++ )
  {
    mean = mean + static_cast<double>(j ) * pdf_vec[j-1];
  }

  mean = mean / pdf_sum;

  return mean;
# undef WORD_LENGTH_MAX
}